

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::ShowMetricsWindow(bool *p_open)

{
  bool *v;
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiWindow *pIVar3;
  ImGuiViewportP *pIVar4;
  ImGuiPopupData *pIVar5;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ImGuiContext *pIVar10;
  int *piVar11;
  int *piVar12;
  bool bVar13;
  ImGuiContext *g;
  ImDrawList *pIVar14;
  ImU32 col;
  ImGuiContext *g_8;
  long lVar15;
  char *pcVar16;
  undefined1 auVar17 [8];
  char *pcVar18;
  int rect_n;
  ImGuiTable *pIVar19;
  ImGuiTableSettings *settings;
  undefined **ppuVar20;
  long lVar21;
  char **ppcVar22;
  int count;
  int iVar23;
  char *pcVar24;
  long lVar25;
  int rect_n_1;
  ulong uVar26;
  ImGuiContext *pIVar27;
  ImVector<ImDrawList_*> *pIVar28;
  ImGuiContext *g_6;
  uint *puVar29;
  uint uVar30;
  ImGuiWindow *window;
  ulong uVar31;
  byte bVar32;
  float fVar33;
  float fVar34;
  float extraout_XMM0_Db;
  float fVar35;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 uVar36;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 uVar37;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  undefined4 uVar43;
  float fVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  ImRect IVar47;
  ImVec2 local_1c8;
  ImGuiContext *local_1c0;
  ImGuiMetricsConfig *local_1b8;
  int *local_1b0;
  int *local_1a8;
  ImVec2 local_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  char buf [128];
  char *wrt_rects_names [8];
  char *trt_rects_names [13];
  
  bVar32 = 0;
  bVar13 = Begin("Dear ImGui Metrics/Debugger",p_open,0);
  pIVar27 = GImGui;
  if (bVar13) {
    Text("Dear ImGui %s","1.81");
    uVar40 = 0;
    uVar42 = 0;
    Text("Application average %.3f ms/frame (%.1f FPS)",
         SUB84((double)(1000.0 / (pIVar27->IO).Framerate),0));
    iVar23 = (pIVar27->IO).MetricsRenderIndices;
    Text("%d vertices, %d indices (%d triangles)",(ulong)(uint)(pIVar27->IO).MetricsRenderVertices,
         (long)iVar23,(ulong)(uint)(iVar23 / 3));
    Text("%d active windows (%d visible)",(ulong)(uint)(pIVar27->IO).MetricsActiveWindows,
         (ulong)(uint)(pIVar27->IO).MetricsRenderWindows);
    Text("%d active allocations",(ulong)(uint)(pIVar27->IO).MetricsActiveAllocations);
    Separator();
    wrt_rects_names[6] = "ContentIdeal";
    wrt_rects_names[7] = "ContentRegionRect";
    wrt_rects_names[4] = "WorkRect";
    wrt_rects_names[5] = "Content";
    wrt_rects_names[2] = "InnerRect";
    wrt_rects_names[3] = "InnerClipRect";
    wrt_rects_names[0] = "OuterRect";
    wrt_rects_names[1] = "OuterRectClipped";
    ppuVar20 = &PTR_anon_var_dwarf_663dd_00181aa0;
    ppcVar22 = trt_rects_names;
    for (lVar15 = 0xd; lVar15 != 0; lVar15 = lVar15 + -1) {
      *ppcVar22 = *ppuVar20;
      ppuVar20 = ppuVar20 + (ulong)bVar32 * -2 + 1;
      ppcVar22 = ppcVar22 + (ulong)bVar32 * -2 + 1;
    }
    local_1b0 = &(pIVar27->DebugMetricsConfig).ShowWindowsRectsType;
    if ((pIVar27->DebugMetricsConfig).ShowWindowsRectsType < 0) {
      *local_1b0 = 4;
    }
    local_1a8 = &(pIVar27->DebugMetricsConfig).ShowTablesRectsType;
    if ((pIVar27->DebugMetricsConfig).ShowTablesRectsType < 0) {
      *local_1a8 = 2;
    }
    local_1b8 = &pIVar27->DebugMetricsConfig;
    bVar13 = TreeNode("Tools");
    local_1c0 = pIVar27;
    if (bVar13) {
      auVar9._8_8_ = 0;
      auVar9[0] = buf[8];
      auVar9[1] = buf[9];
      auVar9[2] = buf[10];
      auVar9[3] = buf[0xb];
      auVar9[4] = buf[0xc];
      auVar9[5] = buf[0xd];
      auVar9[6] = buf[0xe];
      auVar9[7] = buf[0xf];
      buf._0_16_ = auVar9 << 0x40;
      bVar13 = Button("Item Picker..",(ImVec2 *)buf);
      if (bVar13) {
        GImGui->DebugItemPickerActive = true;
      }
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      TextDisabled("(?)");
      bVar13 = IsItemHovered(0);
      if (bVar13) {
        BeginTooltipEx(0,0);
        PushTextWrapPos(GImGui->FontSize * 35.0);
        TextUnformatted("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don\'t have a debugger attached, this will probably crash."
                        ,(char *)0x0);
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        iVar23 = (pIVar3->DC).TextWrapPosStack.Size;
        (pIVar3->DC).TextWrapPos = (pIVar3->DC).TextWrapPosStack.Data[(long)iVar23 + -1];
        (pIVar3->DC).TextWrapPosStack.Size = iVar23 + -1;
        End();
      }
      Checkbox("Show windows begin order",&(pIVar27->DebugMetricsConfig).ShowWindowsBeginOrder);
      Checkbox("Show windows rectangles",&local_1b8->ShowWindowsRects);
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      fVar33 = pIVar10->FontSize;
      *(byte *)&(pIVar10->NextItemData).Flags = (byte)(pIVar10->NextItemData).Flags | 1;
      (pIVar10->NextItemData).Width = fVar33 * 12.0;
      bVar13 = Combo("##show_windows_rect_type",local_1b0,wrt_rects_names,8,8);
      local_1b8->ShowWindowsRects = (bool)(local_1b8->ShowWindowsRects | bVar13);
      if ((local_1b8->ShowWindowsRects != false) && (pIVar27->NavWindow != (ImGuiWindow *)0x0)) {
        lVar15 = 0;
        BulletText("\'%s\':",pIVar27->NavWindow->Name);
        pIVar10 = GImGui;
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar33 = (pIVar10->Style).IndentSpacing + (pIVar3->DC).Indent.x;
        (pIVar3->DC).Indent.x = fVar33;
        (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
        do {
          IVar47 = ShowMetricsWindow::Funcs::GetWindowRect(pIVar27->NavWindow,(int)lVar15);
          uVar40 = 0;
          uVar42 = 0;
          Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",SUB84((double)IVar47.Min.x,0),
               SUB84((double)IVar47.Min.y,0),SUB84((double)IVar47.Max.x,0),(double)IVar47.Max.y,
               (double)(IVar47.Max.x - IVar47.Min.x),(double)(IVar47.Max.y - IVar47.Min.y),
               wrt_rects_names[lVar15]);
          pIVar10 = GImGui;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 8);
        pIVar3 = GImGui->CurrentWindow;
        pIVar3->WriteAccessed = true;
        fVar33 = (pIVar3->DC).Indent.x - (pIVar10->Style).IndentSpacing;
        (pIVar3->DC).Indent.x = fVar33;
        (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      }
      Checkbox("Show ImDrawCmd mesh when hovering",&(pIVar27->DebugMetricsConfig).ShowDrawCmdMesh);
      Checkbox("Show ImDrawCmd bounding boxes when hovering",
               &(pIVar27->DebugMetricsConfig).ShowDrawCmdBoundingBoxes);
      v = &(pIVar27->DebugMetricsConfig).ShowTablesRects;
      Checkbox("Show tables rectangles",v);
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      fVar33 = pIVar10->FontSize;
      *(byte *)&(pIVar10->NextItemData).Flags = (byte)(pIVar10->NextItemData).Flags | 1;
      (pIVar10->NextItemData).Width = fVar33 * 12.0;
      bVar13 = Combo("##show_table_rects_type",local_1a8,trt_rects_names,0xd,0xd);
      *v = (bool)(*v | bVar13);
      if (((*v != false) && (pIVar27->NavWindow != (ImGuiWindow *)0x0)) &&
         (0 < (pIVar27->Tables).Buf.Size)) {
        auVar17 = (undefined1  [8])0x0;
        do {
          pIVar19 = (pIVar27->Tables).Buf.Data;
          if (pIVar27->FrameCount + -1 <= pIVar19[(long)auVar17].LastFrameActive) {
            pIVar19 = pIVar19 + (long)auVar17;
            if ((pIVar19->OuterWindow == pIVar27->NavWindow) ||
               (pIVar19->InnerWindow == pIVar27->NavWindow)) {
              local_178 = auVar17;
              BulletText("Table 0x%08X (%d columns, in \'%s\')",(ulong)pIVar19->ID,
                         (ulong)(uint)pIVar19->ColumnsCount,pIVar19->OuterWindow->Name);
              bVar13 = IsItemHovered(0);
              if (bVar13) {
                pIVar14 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                auVar9 = buf._0_16_;
                IVar1 = (pIVar19->OuterRect).Min;
                buf._4_4_ = IVar1.y + -1.0;
                buf._0_4_ = IVar1.x + -1.0;
                buf._8_8_ = auVar9._8_8_;
                IVar1 = (pIVar19->OuterRect).Max;
                local_1c8.y = IVar1.y + 1.0;
                local_1c8.x = IVar1.x + 1.0;
                uVar40 = 0;
                uVar42 = 0;
                ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,&local_1c8,0xff00ffff,0.0,-1,2.0);
              }
              pIVar27 = GImGui;
              pIVar3 = GImGui->CurrentWindow;
              pIVar3->WriteAccessed = true;
              fVar33 = (pIVar27->Style).IndentSpacing + (pIVar3->DC).Indent.x;
              (pIVar3->DC).Indent.x = fVar33;
              (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
              uVar26 = 0;
              do {
                iVar23 = (int)uVar26;
                if (uVar26 < 6) {
                  IVar47 = ShowMetricsWindow::Funcs::GetTableRect(pIVar19,iVar23,-1);
                  local_198._0_8_ = IVar47.Max;
                  local_198._8_4_ = uVar40;
                  local_198._12_4_ = uVar42;
                  uVar40 = 0;
                  uVar42 = 0;
                  fStack_180 = (float)extraout_XMM0_Dc_00;
                  local_188._0_4_ = IVar47.Min.x;
                  local_188._4_4_ = IVar47.Min.y;
                  fStack_17c = (float)extraout_XMM0_Dd_00;
                  ImFormatString(buf,0x80,"(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s",
                                 SUB84((double)IVar47.Min.x,0),SUB84((double)IVar47.Min.y,0),
                                 SUB84((double)IVar47.Max.x,0),(double)IVar47.Max.y,
                                 (double)(IVar47.Max.x - IVar47.Min.x),
                                 (double)(IVar47.Max.y - IVar47.Min.y),trt_rects_names[uVar26]);
                  local_1c8.x = 0.0;
                  local_1c8.y = 0.0;
                  Selectable(buf,false,0,&local_1c8);
                  bVar13 = IsItemHovered(0);
                  if (bVar13) {
                    pIVar14 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                    local_1c8.y = (float)local_188._4_4_ + -1.0;
                    local_1c8.x = (float)local_188._0_4_ + -1.0;
                    local_1a0.y = (float)local_198._4_4_ + 1.0;
                    local_1a0.x = (float)local_198._0_4_ + 1.0;
                    uVar40 = 0;
                    uVar42 = 0;
                    ImDrawList::AddRect(pIVar14,&local_1c8,&local_1a0,0xff00ffff,0.0,-1,2.0);
                  }
                }
                else if (((iVar23 == 8) || (iVar23 == 6)) && (0 < pIVar19->ColumnsCount)) {
                  uVar31 = 0;
                  do {
                    IVar47 = ShowMetricsWindow::Funcs::GetTableRect(pIVar19,iVar23,(int)uVar31);
                    local_198._0_8_ = IVar47.Max;
                    local_198._8_4_ = uVar40;
                    local_198._12_4_ = uVar42;
                    uVar40 = 0;
                    uVar42 = 0;
                    fStack_180 = (float)extraout_XMM0_Dc;
                    local_188._0_4_ = IVar47.Min.x;
                    local_188._4_4_ = IVar47.Min.y;
                    fStack_17c = (float)extraout_XMM0_Dd;
                    ImFormatString(buf,0x80,
                                   "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s",
                                   SUB84((double)IVar47.Min.x,0),SUB84((double)IVar47.Min.y,0),
                                   SUB84((double)IVar47.Max.x,0),(double)IVar47.Max.y,
                                   (double)(IVar47.Max.x - IVar47.Min.x),
                                   (double)(IVar47.Max.y - IVar47.Min.y),uVar31,
                                   trt_rects_names[uVar26]);
                    local_1c8.x = 0.0;
                    local_1c8.y = 0.0;
                    Selectable(buf,false,0,&local_1c8);
                    bVar13 = IsItemHovered(0);
                    if (bVar13) {
                      pIVar14 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
                      local_1c8.y = (float)local_188._4_4_ + -1.0;
                      local_1c8.x = (float)local_188._0_4_ + -1.0;
                      local_1a0.y = (float)local_198._4_4_ + 1.0;
                      local_1a0.x = (float)local_198._0_4_ + 1.0;
                      uVar40 = 0;
                      uVar42 = 0;
                      ImDrawList::AddRect(pIVar14,&local_1c8,&local_1a0,0xff00ffff,0.0,-1,2.0);
                    }
                    uVar30 = (int)uVar31 + 1;
                    uVar31 = (ulong)uVar30;
                  } while ((int)uVar30 < pIVar19->ColumnsCount);
                }
                pIVar27 = GImGui;
                uVar26 = uVar26 + 1;
              } while (uVar26 != 0xd);
              pIVar3 = GImGui->CurrentWindow;
              pIVar3->WriteAccessed = true;
              fVar33 = (pIVar3->DC).Indent.x - (pIVar27->Style).IndentSpacing;
              (pIVar3->DC).Indent.x = fVar33;
              (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
              auVar17 = local_178;
              pIVar27 = local_1c0;
            }
          }
          auVar17 = (undefined1  [8])((long)auVar17 + 1);
        } while ((long)auVar17 < (long)(pIVar27->Tables).Buf.Size);
      }
      TreePop();
    }
    local_198._0_8_ = &pIVar27->Windows;
    DebugNodeWindowsList(&pIVar27->Windows,"Windows");
    lVar15 = (long)(pIVar27->Viewports).Size;
    if (lVar15 < 1) {
      uVar26 = 0;
    }
    else {
      lVar21 = 0;
      uVar26 = 0;
      do {
        lVar25 = 0;
        iVar23 = 0;
        do {
          iVar23 = iVar23 + *(int *)((long)&((pIVar27->Viewports).Data[lVar21]->DrawDataBuilder).
                                            Layers[0].Size + lVar25);
          lVar25 = lVar25 + 0x10;
        } while (lVar25 == 0x10);
        uVar26 = (ulong)(uint)((int)uVar26 + iVar23);
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar15);
    }
    bVar13 = TreeNode("DrawLists","DrawLists (%d)",uVar26);
    if (bVar13) {
      if (0 < (pIVar27->Viewports).Size) {
        lVar15 = 0;
        do {
          pIVar4 = (pIVar27->Viewports).Data[lVar15];
          lVar21 = 0;
          do {
            if (0 < (pIVar4->DrawDataBuilder).Layers[lVar21].Size) {
              pIVar28 = (pIVar4->DrawDataBuilder).Layers + lVar21;
              lVar25 = 0;
              do {
                DebugNodeDrawList((ImGuiWindow *)0x0,pIVar28->Data[lVar25],"DrawList");
                lVar25 = lVar25 + 1;
              } while (lVar25 < pIVar28->Size);
            }
            bVar13 = lVar21 == 0;
            lVar21 = lVar21 + 1;
          } while (bVar13);
          lVar15 = lVar15 + 1;
          pIVar27 = local_1c0;
        } while (lVar15 < (local_1c0->Viewports).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Viewports","Viewports (%d)",(ulong)(uint)(pIVar27->Viewports).Size);
    if (bVar13) {
      fVar33 = GetTreeNodeToLabelSpacing();
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar44 = extraout_XMM0_Db;
      if ((fVar33 == 0.0) && (!NAN(fVar33))) {
        fVar33 = (pIVar10->Style).IndentSpacing;
        fVar44 = 0.0;
      }
      fVar33 = fVar33 + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar33;
      fVar33 = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      (pIVar3->DC).CursorPos.x = fVar33;
      iVar23 = (pIVar10->Viewports).Size;
      local_168 = _DAT_00167040;
      _local_178 = _DAT_00166fa0;
      if (0 < (long)iVar23) {
        uVar40 = 0x7f7fffff;
        uVar42 = 0x7f7fffff;
        uVar36 = 0;
        uVar37 = 0;
        uVar38 = 0xff7fffff;
        uVar39 = 0xff7fffff;
        uVar41 = 0;
        uVar43 = 0;
        lVar15 = 0;
        do {
          pIVar4 = (pIVar10->Viewports).Data[lVar15];
          IVar1 = (pIVar4->super_ImGuiViewport).Pos;
          auVar46._8_8_ = 0;
          auVar46._0_4_ = IVar1.x;
          auVar46._4_4_ = IVar1.y;
          IVar2 = (pIVar4->super_ImGuiViewport).Size;
          auVar45._0_4_ = IVar2.x + IVar1.x;
          auVar45._4_4_ = IVar2.y + IVar1.y;
          auVar45._8_8_ = 0;
          auVar8._4_4_ = uVar39;
          auVar8._0_4_ = uVar38;
          auVar8._8_4_ = uVar41;
          auVar8._12_4_ = uVar43;
          local_168 = maxps(auVar45,auVar8);
          auVar7._4_4_ = uVar42;
          auVar7._0_4_ = uVar40;
          auVar7._8_4_ = uVar36;
          auVar7._12_4_ = uVar37;
          _local_178 = minps(auVar46,auVar7);
          lVar15 = lVar15 + 1;
          uVar38 = local_168._0_4_;
          uVar39 = local_168._4_4_;
          uVar41 = local_168._8_4_;
          uVar43 = local_168._12_4_;
          uVar40 = local_178._0_4_;
          uVar42 = local_178._4_4_;
          uVar36 = local_178._8_4_;
          uVar37 = local_178._12_4_;
        } while (iVar23 != lVar15);
      }
      if (0 < iVar23) {
        local_188._0_4_ = fVar33 + (float)local_178._0_4_ * -0.125;
        local_188._4_4_ = (pIVar3->DC).CursorPos.y + (float)local_178._4_4_ * -0.125;
        lVar15 = 0;
        fStack_180 = fVar44 + fStack_170 * 0.0;
        fStack_17c = fStack_16c * 0.0 + 0.0;
        fVar33 = (float)local_188._0_4_;
        fVar44 = (float)local_188._4_4_;
        do {
          pIVar4 = (pIVar10->Viewports).Data[lVar15];
          IVar1 = (pIVar4->super_ImGuiViewport).Pos;
          fVar34 = IVar1.x;
          fVar35 = IVar1.y;
          IVar1 = (pIVar4->super_ImGuiViewport).Size;
          buf._4_4_ = fVar35 * 0.125 + fVar44;
          buf._0_4_ = fVar34 * 0.125 + fVar33;
          buf._8_4_ = (IVar1.x + fVar34) * 0.125 + fVar33;
          buf._12_4_ = (IVar1.y + fVar35) * 0.125 + fVar44;
          DebugRenderViewportThumbnail(pIVar3->DrawList,pIVar4,(ImRect *)buf);
          lVar15 = lVar15 + 1;
          fVar33 = (float)local_188._0_4_;
          fVar44 = (float)local_188._4_4_;
        } while (lVar15 < (pIVar10->Viewports).Size);
      }
      buf._4_4_ = ((float)local_168._4_4_ - (float)local_178._4_4_) * 0.125;
      buf._0_4_ = ((float)local_168._0_4_ - (float)local_178._0_4_) * 0.125;
      Dummy((ImVec2 *)buf);
      fVar33 = GetTreeNodeToLabelSpacing();
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if ((fVar33 == 0.0) && (!NAN(fVar33))) {
        fVar33 = (pIVar10->Style).IndentSpacing;
      }
      fVar33 = (pIVar3->DC).Indent.x - fVar33;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      if (0 < (pIVar27->Viewports).Size) {
        lVar15 = 0;
        do {
          DebugNodeViewport((pIVar27->Viewports).Data[lVar15]);
          lVar15 = lVar15 + 1;
        } while (lVar15 < (pIVar27->Viewports).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Popups","Popups (%d)",(ulong)(uint)(pIVar27->OpenPopupStack).Size);
    if (bVar13) {
      if (0 < (pIVar27->OpenPopupStack).Size) {
        lVar21 = 8;
        lVar15 = 0;
        do {
          pIVar5 = (pIVar27->OpenPopupStack).Data;
          puVar6 = *(undefined8 **)((long)&pIVar5->PopupId + lVar21);
          pcVar18 = "NULL";
          if (puVar6 != (undefined8 *)0x0) {
            pcVar18 = (char *)*puVar6;
          }
          pcVar16 = "";
          if ((puVar6 != (undefined8 *)0x0) &&
             (pcVar16 = " ChildWindow", (*(byte *)((long)puVar6 + 0xf) & 1) == 0)) {
            pcVar16 = "";
          }
          pcVar24 = "";
          if ((puVar6 != (undefined8 *)0x0) &&
             (pcVar24 = " ChildMenu", (*(byte *)((long)puVar6 + 0xf) & 0x10) == 0)) {
            pcVar24 = "";
          }
          BulletText("PopupID: %08x, Window: \'%s\'%s%s",
                     (ulong)*(uint *)((long)pIVar5 + lVar21 + -8),pcVar18,pcVar16,pcVar24);
          lVar15 = lVar15 + 1;
          lVar21 = lVar21 + 0x30;
          pIVar27 = local_1c0;
        } while (lVar15 < (local_1c0->OpenPopupStack).Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("TabBars","Tab Bars (%d)",(ulong)(uint)(pIVar27->TabBars).Buf.Size);
    if (bVar13) {
      if (0 < (pIVar27->TabBars).Buf.Size) {
        lVar15 = 0;
        lVar21 = 0;
        do {
          DebugNodeTabBar((ImGuiTabBar *)
                          ((long)&(((pIVar27->TabBars).Buf.Data)->Tabs).Size + lVar15),"TabBar");
          lVar21 = lVar21 + 1;
          lVar15 = lVar15 + 0x98;
        } while (lVar21 < (pIVar27->TabBars).Buf.Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Tables","Tables (%d)",(ulong)(uint)(pIVar27->Tables).Buf.Size);
    if (bVar13) {
      if (0 < (pIVar27->Tables).Buf.Size) {
        lVar15 = 0;
        lVar21 = 0;
        do {
          DebugNodeTable((ImGuiTable *)((long)&((pIVar27->Tables).Buf.Data)->ID + lVar15));
          lVar21 = lVar21 + 1;
          lVar15 = lVar15 + 600;
        } while (lVar21 < (pIVar27->Tables).Buf.Size);
      }
      TreePop();
    }
    bVar13 = TreeNode("Settings");
    if (bVar13) {
      bVar13 = SmallButton("Clear");
      if (bVar13) {
        ClearIniSettings();
      }
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      bVar13 = SmallButton("Save to memory");
      if (bVar13) {
        SaveIniSettingsToMemory((size_t *)0x0);
      }
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      bVar13 = SmallButton("Save to disk");
      if (bVar13) {
        SaveIniSettingsToDisk((pIVar27->IO).IniFilename);
      }
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      if (pIVar3->SkipItems == false) {
        (pIVar3->DC).CursorPos.x = (pIVar10->Style).ItemSpacing.x + (pIVar3->DC).CursorPosPrevLine.x
        ;
        (pIVar3->DC).CursorPos.y = (pIVar3->DC).CursorPosPrevLine.y;
        (pIVar3->DC).CurrLineSize = (pIVar3->DC).PrevLineSize;
        (pIVar3->DC).CurrLineTextBaseOffset = (pIVar3->DC).PrevLineTextBaseOffset;
      }
      if ((pIVar27->IO).IniFilename == (char *)0x0) {
        TextUnformatted("<NULL>",(char *)0x0);
      }
      else {
        Text("\"%s\"");
      }
      Text("SettingsDirtyTimer %.2f",SUB84((double)pIVar27->SettingsDirtyTimer,0));
      bVar13 = TreeNode("SettingsHandlers","Settings handlers: (%d)",
                        (ulong)(uint)(pIVar27->SettingsHandlers).Size);
      if (bVar13) {
        if (0 < (pIVar27->SettingsHandlers).Size) {
          lVar15 = 0;
          lVar21 = 0;
          do {
            BulletText("%s",*(undefined8 *)
                             ((long)&((pIVar27->SettingsHandlers).Data)->TypeName + lVar15));
            lVar21 = lVar21 + 1;
            lVar15 = lVar15 + 0x48;
          } while (lVar21 < (pIVar27->SettingsHandlers).Size);
        }
        TreePop();
      }
      bVar13 = TreeNode("SettingsWindows","Settings packed data: Windows: %d bytes",
                        (ulong)(uint)(pIVar27->SettingsWindows).Buf.Size);
      if (bVar13) {
        pcVar18 = (pIVar27->SettingsWindows).Buf.Data;
        if (pcVar18 != (char *)0x0) {
          puVar29 = (uint *)(pcVar18 + 4);
          do {
            Text("0x%08X \"%s\" Pos (%d,%d) Size (%d,%d) Collapsed=%d",(ulong)*puVar29,puVar29 + 4,
                 (ulong)(uint)(int)(short)puVar29[1],(ulong)(uint)(int)*(short *)((long)puVar29 + 6)
                 ,(ulong)(uint)(int)(short)puVar29[2],
                 (ulong)(uint)(int)*(short *)((long)puVar29 + 10),(ulong)(byte)puVar29[3]);
            puVar29 = (uint *)((long)(int)puVar29[-1] + (long)puVar29);
          } while (puVar29 !=
                   (uint *)((pIVar27->SettingsWindows).Buf.Data +
                           (long)(pIVar27->SettingsWindows).Buf.Size + 4));
        }
        TreePop();
      }
      bVar13 = TreeNode("SettingsTables","Settings packed data: Tables: %d bytes",
                        (ulong)(uint)(pIVar27->SettingsTables).Buf.Size);
      if (bVar13) {
        pcVar18 = (pIVar27->SettingsTables).Buf.Data;
        if (pcVar18 != (char *)0x0) {
          settings = (ImGuiTableSettings *)(pcVar18 + 4);
          do {
            DebugNodeTableSettings(settings);
            iVar23._0_1_ = settings[-1].ColumnsCount;
            iVar23._1_1_ = settings[-1].ColumnsCountMax;
            iVar23._2_1_ = settings[-1].WantApply;
            iVar23._3_1_ = settings[-1].field_0xf;
            settings = (ImGuiTableSettings *)((long)&settings->ID + (long)iVar23);
          } while (settings !=
                   (ImGuiTableSettings *)
                   ((pIVar27->SettingsTables).Buf.Data +
                   (long)(pIVar27->SettingsTables).Buf.Size + 4));
        }
        TreePop();
      }
      iVar23 = (pIVar27->SettingsIniData).Buf.Size;
      uVar26 = (ulong)(iVar23 - 1);
      if (iVar23 == 0) {
        uVar26 = 0;
      }
      bVar13 = TreeNode("SettingsIniData","Settings unpacked data (.ini): %d bytes",uVar26);
      if (bVar13) {
        pcVar18 = (pIVar27->SettingsIniData).Buf.Data;
        if (pcVar18 == (char *)0x0) {
          pcVar18 = ImGuiTextBuffer::EmptyString;
        }
        buf._4_4_ = GImGui->FontSize * 20.0;
        buf[0] = '\0';
        buf[1] = '\0';
        buf[2] = -0x80;
        buf[3] = -0x80;
        InputTextMultiline("##Ini",pcVar18,(long)(pIVar27->SettingsIniData).Buf.Size,(ImVec2 *)buf,
                           0x4000,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      TreePop();
    }
    bVar13 = TreeNode("Internal state");
    if (bVar13) {
      Text("WINDOWING");
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar10->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      pcVar16 = "NULL";
      pcVar18 = "NULL";
      if (pIVar27->HoveredWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->HoveredWindow->Name;
      }
      Text("HoveredWindow: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar27->HoveredRootWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->HoveredRootWindow->Name;
      }
      Text("HoveredRootWindow: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar27->HoveredWindowUnderMovingWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->HoveredWindowUnderMovingWindow->Name;
      }
      Text("HoveredWindowUnderMovingWindow: \'%s\'",pcVar18);
      pcVar18 = "NULL";
      if (pIVar27->MovingWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->MovingWindow->Name;
      }
      Text("MovingWindow: \'%s\'",pcVar18);
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar3->DC).Indent.x - (pIVar10->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      Text("ITEMS");
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar10->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s",
           SUB84((double)pIVar27->ActiveIdTimer,0),(ulong)pIVar27->ActiveId,
           (ulong)pIVar27->ActiveIdPreviousFrame,(ulong)pIVar27->ActiveIdAllowOverlap,
           (&PTR_anon_var_dwarf_66772_00181b10)[pIVar27->ActiveIdSource]);
      pcVar18 = "NULL";
      if (pIVar27->ActiveIdWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->ActiveIdWindow->Name;
      }
      Text("ActiveIdWindow: \'%s\'",pcVar18);
      Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d",
           SUB84((double)pIVar27->HoveredIdTimer,0),(ulong)pIVar27->HoveredId,
           (ulong)pIVar27->HoveredIdPreviousFrame,(ulong)pIVar27->HoveredIdAllowOverlap);
      Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)",
           (ulong)pIVar27->DragDropActive,(ulong)(pIVar27->DragDropPayload).SourceId,
           (pIVar27->DragDropPayload).DataType,(ulong)(uint)(pIVar27->DragDropPayload).DataSize);
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar3->DC).Indent.x - (pIVar10->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      Text("NAV,FOCUS");
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar10->Style).IndentSpacing + (pIVar3->DC).Indent.x;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      pcVar18 = "NULL";
      if (pIVar27->NavWindow != (ImGuiWindow *)0x0) {
        pcVar18 = pIVar27->NavWindow->Name;
      }
      Text("NavWindow: \'%s\'",pcVar18);
      Text("NavId: 0x%08X, NavLayer: %d",(ulong)pIVar27->NavId,(ulong)pIVar27->NavLayer);
      Text("NavInputSource: %s",(&PTR_anon_var_dwarf_66772_00181b10)[pIVar27->NavInputSource]);
      Text("NavActive: %d, NavVisible: %d",(ulong)(pIVar27->IO).NavActive,
           (ulong)(pIVar27->IO).NavVisible);
      Text("NavActivateId: 0x%08X, NavInputId: 0x%08X",(ulong)pIVar27->NavActivateId,
           (ulong)pIVar27->NavInputId);
      Text("NavDisableHighlight: %d, NavDisableMouseHover: %d",(ulong)pIVar27->NavDisableHighlight,
           (ulong)pIVar27->NavDisableMouseHover);
      Text("NavFocusScopeId = 0x%08X",(ulong)pIVar27->NavFocusScopeId);
      if (pIVar27->NavWindowingTarget != (ImGuiWindow *)0x0) {
        pcVar16 = pIVar27->NavWindowingTarget->Name;
      }
      Text("NavWindowingTarget: \'%s\'",pcVar16);
      pIVar10 = GImGui;
      pIVar3 = GImGui->CurrentWindow;
      pIVar3->WriteAccessed = true;
      fVar33 = (pIVar3->DC).Indent.x - (pIVar10->Style).IndentSpacing;
      (pIVar3->DC).Indent.x = fVar33;
      (pIVar3->DC).CursorPos.x = fVar33 + (pIVar3->Pos).x + (pIVar3->DC).ColumnsOffset.x;
      TreePop();
    }
    if (((local_1b8->ShowWindowsRects != false) ||
        ((pIVar27->DebugMetricsConfig).ShowWindowsBeginOrder == true)) &&
       (0 < *(int *)local_198._0_8_)) {
      lVar15 = 0;
      do {
        pIVar3 = (pIVar27->Windows).Data[lVar15];
        if (pIVar3->WasActive == true) {
          pIVar14 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if (local_1b8->ShowWindowsRects == true) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetWindowRect(pIVar3,*local_1b0);
            ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
          }
          if (((local_1c0->DebugMetricsConfig).ShowWindowsBeginOrder == true) &&
             ((pIVar3->Flags & 0x1000000) == 0)) {
            ImFormatString(buf,0x20,"%d",(ulong)(uint)(int)pIVar3->BeginOrderWithinContext);
            local_1c8.y = GImGui->FontSize + (pIVar3->Pos).y;
            local_1c8.x = GImGui->FontSize + (pIVar3->Pos).x;
            ImDrawList::AddRectFilled(pIVar14,&pIVar3->Pos,&local_1c8,0xff6464c8,0.0,0xf);
            ImDrawList::AddText(pIVar14,&pIVar3->Pos,0xffffffff,buf,(char *)0x0);
          }
        }
        lVar15 = lVar15 + 1;
        pIVar27 = local_1c0;
      } while (lVar15 < *(int *)local_198._0_8_);
    }
    piVar11 = local_1a8;
    if (((pIVar27->DebugMetricsConfig).ShowTablesRects == true) && (0 < (pIVar27->Tables).Buf.Size))
    {
      lVar15 = 0;
      do {
        piVar12 = local_1a8;
        pIVar19 = (pIVar27->Tables).Buf.Data;
        if (pIVar27->FrameCount + -1 <= pIVar19[lVar15].LastFrameActive) {
          pIVar19 = pIVar19 + lVar15;
          pIVar14 = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
          if (*piVar12 < 6) {
            buf._0_16_ = (undefined1  [16])
                         ShowMetricsWindow::Funcs::GetTableRect(pIVar19,*piVar12,-1);
            ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),0xff8000ff,0.0,0xf,1.0);
          }
          else if (0 < pIVar19->ColumnsCount) {
            iVar23 = 0;
            do {
              buf._0_16_ = (undefined1  [16])
                           ShowMetricsWindow::Funcs::GetTableRect(pIVar19,*piVar11,iVar23);
              bVar13 = iVar23 == pIVar19->HoveredColumnBody;
              col = 0xff8000ff;
              if (bVar13) {
                col = 0xff80ffff;
              }
              ImDrawList::AddRect(pIVar14,(ImVec2 *)buf,(ImVec2 *)(buf + 8),col,0.0,-1,
                                  *(float *)(&DAT_0016797c + (ulong)bVar13 * 4));
              iVar23 = iVar23 + 1;
            } while (iVar23 < pIVar19->ColumnsCount);
          }
        }
        lVar15 = lVar15 + 1;
        pIVar27 = local_1c0;
      } while (lVar15 < (local_1c0->Tables).Buf.Size);
    }
    End();
    return;
  }
  End();
  return;
}

Assistant:

void ImGui::ShowMetricsWindow(bool* p_open)
{
    if (!Begin("Dear ImGui Metrics/Debugger", p_open))
    {
        End();
        return;
    }

    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiMetricsConfig* cfg = &g.DebugMetricsConfig;

    // Basic info
    Text("Dear ImGui %s", GetVersion());
    Text("Application average %.3f ms/frame (%.1f FPS)", 1000.0f / io.Framerate, io.Framerate);
    Text("%d vertices, %d indices (%d triangles)", io.MetricsRenderVertices, io.MetricsRenderIndices, io.MetricsRenderIndices / 3);
    Text("%d active windows (%d visible)", io.MetricsActiveWindows, io.MetricsRenderWindows);
    Text("%d active allocations", io.MetricsActiveAllocations);
    //SameLine(); if (SmallButton("GC")) { g.GcCompactAll = true; }

    Separator();

    // Debugging enums
    enum { WRT_OuterRect, WRT_OuterRectClipped, WRT_InnerRect, WRT_InnerClipRect, WRT_WorkRect, WRT_Content, WRT_ContentIdeal, WRT_ContentRegionRect, WRT_Count }; // Windows Rect Type
    const char* wrt_rects_names[WRT_Count] = { "OuterRect", "OuterRectClipped", "InnerRect", "InnerClipRect", "WorkRect", "Content", "ContentIdeal", "ContentRegionRect" };
    enum { TRT_OuterRect, TRT_InnerRect, TRT_WorkRect, TRT_HostClipRect, TRT_InnerClipRect, TRT_BackgroundClipRect, TRT_ColumnsRect, TRT_ColumnsWorkRect, TRT_ColumnsClipRect, TRT_ColumnsContentHeadersUsed, TRT_ColumnsContentHeadersIdeal, TRT_ColumnsContentFrozen, TRT_ColumnsContentUnfrozen, TRT_Count }; // Tables Rect Type
    const char* trt_rects_names[TRT_Count] = { "OuterRect", "InnerRect", "WorkRect", "HostClipRect", "InnerClipRect", "BackgroundClipRect", "ColumnsRect", "ColumnsWorkRect", "ColumnsClipRect", "ColumnsContentHeadersUsed", "ColumnsContentHeadersIdeal", "ColumnsContentFrozen", "ColumnsContentUnfrozen" };
    if (cfg->ShowWindowsRectsType < 0)
        cfg->ShowWindowsRectsType = WRT_WorkRect;
    if (cfg->ShowTablesRectsType < 0)
        cfg->ShowTablesRectsType = TRT_WorkRect;

    struct Funcs
    {
        static ImRect GetTableRect(ImGuiTable* table, int rect_type, int n)
        {
            if (rect_type == TRT_OuterRect)                     { return table->OuterRect; }
            else if (rect_type == TRT_InnerRect)                { return table->InnerRect; }
            else if (rect_type == TRT_WorkRect)                 { return table->WorkRect; }
            else if (rect_type == TRT_HostClipRect)             { return table->HostClipRect; }
            else if (rect_type == TRT_InnerClipRect)            { return table->InnerClipRect; }
            else if (rect_type == TRT_BackgroundClipRect)       { return table->BgClipRect; }
            else if (rect_type == TRT_ColumnsRect)              { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->MinX, table->InnerClipRect.Min.y, c->MaxX, table->InnerClipRect.Min.y + table->LastOuterHeight); }
            else if (rect_type == TRT_ColumnsWorkRect)          { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->WorkRect.Min.y, c->WorkMaxX, table->WorkRect.Max.y); }
            else if (rect_type == TRT_ColumnsClipRect)          { ImGuiTableColumn* c = &table->Columns[n]; return c->ClipRect; }
            else if (rect_type == TRT_ColumnsContentHeadersUsed){ ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersUsed, table->InnerClipRect.Min.y + table->LastFirstRowHeight); } // Note: y1/y2 not always accurate
            else if (rect_type == TRT_ColumnsContentHeadersIdeal){ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXHeadersIdeal, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentFrozen)     { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y, c->ContentMaxXFrozen, table->InnerClipRect.Min.y + table->LastFirstRowHeight); }
            else if (rect_type == TRT_ColumnsContentUnfrozen)   { ImGuiTableColumn* c = &table->Columns[n]; return ImRect(c->WorkMinX, table->InnerClipRect.Min.y + table->LastFirstRowHeight, c->ContentMaxXUnfrozen, table->InnerClipRect.Max.y); }
            IM_ASSERT(0);
            return ImRect();
        }

        static ImRect GetWindowRect(ImGuiWindow* window, int rect_type)
        {
            if (rect_type == WRT_OuterRect)                 { return window->Rect(); }
            else if (rect_type == WRT_OuterRectClipped)     { return window->OuterRectClipped; }
            else if (rect_type == WRT_InnerRect)            { return window->InnerRect; }
            else if (rect_type == WRT_InnerClipRect)        { return window->InnerClipRect; }
            else if (rect_type == WRT_WorkRect)             { return window->WorkRect; }
            else if (rect_type == WRT_Content)       { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSize); }
            else if (rect_type == WRT_ContentIdeal)         { ImVec2 min = window->InnerRect.Min - window->Scroll + window->WindowPadding; return ImRect(min, min + window->ContentSizeIdeal); }
            else if (rect_type == WRT_ContentRegionRect)    { return window->ContentRegionRect; }
            IM_ASSERT(0);
            return ImRect();
        }
    };

    // Tools
    if (TreeNode("Tools"))
    {
        // The Item Picker tool is super useful to visually select an item and break into the call-stack of where it was submitted.
        if (Button("Item Picker.."))
            DebugStartItemPicker();
        SameLine();
        MetricsHelpMarker("Will call the IM_DEBUG_BREAK() macro to break in debugger.\nWarning: If you don't have a debugger attached, this will probably crash.");

        Checkbox("Show windows begin order", &cfg->ShowWindowsBeginOrder);
        Checkbox("Show windows rectangles", &cfg->ShowWindowsRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowWindowsRects |= Combo("##show_windows_rect_type", &cfg->ShowWindowsRectsType, wrt_rects_names, WRT_Count, WRT_Count);
        if (cfg->ShowWindowsRects && g.NavWindow != NULL)
        {
            BulletText("'%s':", g.NavWindow->Name);
            Indent();
            for (int rect_n = 0; rect_n < WRT_Count; rect_n++)
            {
                ImRect r = Funcs::GetWindowRect(g.NavWindow, rect_n);
                Text("(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), wrt_rects_names[rect_n]);
            }
            Unindent();
        }
        Checkbox("Show ImDrawCmd mesh when hovering", &cfg->ShowDrawCmdMesh);
        Checkbox("Show ImDrawCmd bounding boxes when hovering", &cfg->ShowDrawCmdBoundingBoxes);

        Checkbox("Show tables rectangles", &cfg->ShowTablesRects);
        SameLine();
        SetNextItemWidth(GetFontSize() * 12);
        cfg->ShowTablesRects |= Combo("##show_table_rects_type", &cfg->ShowTablesRectsType, trt_rects_names, TRT_Count, TRT_Count);
        if (cfg->ShowTablesRects && g.NavWindow != NULL)
        {
            for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
            {
                ImGuiTable* table = g.Tables.GetByIndex(table_n);
                if (table->LastFrameActive < g.FrameCount - 1 || (table->OuterWindow != g.NavWindow && table->InnerWindow != g.NavWindow))
                    continue;

                BulletText("Table 0x%08X (%d columns, in '%s')", table->ID, table->ColumnsCount, table->OuterWindow->Name);
                if (IsItemHovered())
                    GetForegroundDrawList()->AddRect(table->OuterRect.Min - ImVec2(1, 1), table->OuterRect.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                Indent();
                char buf[128];
                for (int rect_n = 0; rect_n < TRT_Count; rect_n++)
                {
                    if (rect_n >= TRT_ColumnsRect)
                    {
                        if (rect_n != TRT_ColumnsRect && rect_n != TRT_ColumnsClipRect)
                            continue;
                        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                        {
                            ImRect r = Funcs::GetTableRect(table, rect_n, column_n);
                            ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) Col %d %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), column_n, trt_rects_names[rect_n]);
                            Selectable(buf);
                            if (IsItemHovered())
                                GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                        }
                    }
                    else
                    {
                        ImRect r = Funcs::GetTableRect(table, rect_n, -1);
                        ImFormatString(buf, IM_ARRAYSIZE(buf), "(%6.1f,%6.1f) (%6.1f,%6.1f) Size (%6.1f,%6.1f) %s", r.Min.x, r.Min.y, r.Max.x, r.Max.y, r.GetWidth(), r.GetHeight(), trt_rects_names[rect_n]);
                        Selectable(buf);
                        if (IsItemHovered())
                            GetForegroundDrawList()->AddRect(r.Min - ImVec2(1, 1), r.Max + ImVec2(1, 1), IM_COL32(255, 255, 0, 255), 0.0f, ~0, 2.0f);
                    }
                }
                Unindent();
            }
        }

        TreePop();
    }

    // Windows
    DebugNodeWindowsList(&g.Windows, "Windows");
    //DebugNodeWindowsList(&g.WindowsFocusOrder, "WindowsFocusOrder");

    // DrawLists
    int drawlist_count = 0;
    for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        drawlist_count += g.Viewports[viewport_i]->DrawDataBuilder.GetDrawListCount();
    if (TreeNode("DrawLists", "DrawLists (%d)", drawlist_count))
    {
        for (int viewport_i = 0; viewport_i < g.Viewports.Size; viewport_i++)
        {
            ImGuiViewportP* viewport = g.Viewports[viewport_i];
            for (int layer_i = 0; layer_i < IM_ARRAYSIZE(viewport->DrawDataBuilder.Layers); layer_i++)
                for (int draw_list_i = 0; draw_list_i < viewport->DrawDataBuilder.Layers[layer_i].Size; draw_list_i++)
                    DebugNodeDrawList(NULL, viewport->DrawDataBuilder.Layers[layer_i][draw_list_i], "DrawList");
        }
        TreePop();
    }

    // Viewports
    if (TreeNode("Viewports", "Viewports (%d)", g.Viewports.Size))
    {
        Indent(GetTreeNodeToLabelSpacing());
        RenderViewportsThumbnails();
        Unindent(GetTreeNodeToLabelSpacing());
        for (int i = 0; i < g.Viewports.Size; i++)
            DebugNodeViewport(g.Viewports[i]);
        TreePop();
    }

    // Details for Popups
    if (TreeNode("Popups", "Popups (%d)", g.OpenPopupStack.Size))
    {
        for (int i = 0; i < g.OpenPopupStack.Size; i++)
        {
            ImGuiWindow* window = g.OpenPopupStack[i].Window;
            BulletText("PopupID: %08x, Window: '%s'%s%s", g.OpenPopupStack[i].PopupId, window ? window->Name : "NULL", window && (window->Flags & ImGuiWindowFlags_ChildWindow) ? " ChildWindow" : "", window && (window->Flags & ImGuiWindowFlags_ChildMenu) ? " ChildMenu" : "");
        }
        TreePop();
    }

    // Details for TabBars
    if (TreeNode("TabBars", "Tab Bars (%d)", g.TabBars.GetSize()))
    {
        for (int n = 0; n < g.TabBars.GetSize(); n++)
            DebugNodeTabBar(g.TabBars.GetByIndex(n), "TabBar");
        TreePop();
    }

    // Details for Tables
#ifdef IMGUI_HAS_TABLE
    if (TreeNode("Tables", "Tables (%d)", g.Tables.GetSize()))
    {
        for (int n = 0; n < g.Tables.GetSize(); n++)
            DebugNodeTable(g.Tables.GetByIndex(n));
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_TABLE

    // Details for Docking
#ifdef IMGUI_HAS_DOCK
    if (TreeNode("Docking"))
    {
        TreePop();
    }
#endif // #ifdef IMGUI_HAS_DOCK

    // Settings
    if (TreeNode("Settings"))
    {
        if (SmallButton("Clear"))
            ClearIniSettings();
        SameLine();
        if (SmallButton("Save to memory"))
            SaveIniSettingsToMemory();
        SameLine();
        if (SmallButton("Save to disk"))
            SaveIniSettingsToDisk(g.IO.IniFilename);
        SameLine();
        if (g.IO.IniFilename)
            Text("\"%s\"", g.IO.IniFilename);
        else
            TextUnformatted("<NULL>");
        Text("SettingsDirtyTimer %.2f", g.SettingsDirtyTimer);
        if (TreeNode("SettingsHandlers", "Settings handlers: (%d)", g.SettingsHandlers.Size))
        {
            for (int n = 0; n < g.SettingsHandlers.Size; n++)
                BulletText("%s", g.SettingsHandlers[n].TypeName);
            TreePop();
        }
        if (TreeNode("SettingsWindows", "Settings packed data: Windows: %d bytes", g.SettingsWindows.size()))
        {
            for (ImGuiWindowSettings* settings = g.SettingsWindows.begin(); settings != NULL; settings = g.SettingsWindows.next_chunk(settings))
                DebugNodeWindowSettings(settings);
            TreePop();
        }

#ifdef IMGUI_HAS_TABLE
        if (TreeNode("SettingsTables", "Settings packed data: Tables: %d bytes", g.SettingsTables.size()))
        {
            for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
                DebugNodeTableSettings(settings);
            TreePop();
        }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

        if (TreeNode("SettingsIniData", "Settings unpacked data (.ini): %d bytes", g.SettingsIniData.size()))
        {
            InputTextMultiline("##Ini", (char*)(void*)g.SettingsIniData.c_str(), g.SettingsIniData.Buf.Size, ImVec2(-FLT_MIN, GetTextLineHeight() * 20), ImGuiInputTextFlags_ReadOnly);
            TreePop();
        }
        TreePop();
    }

    // Misc Details
    if (TreeNode("Internal state"))
    {
        const char* input_source_names[] = { "None", "Mouse", "Nav", "NavKeyboard", "NavGamepad" }; IM_ASSERT(IM_ARRAYSIZE(input_source_names) == ImGuiInputSource_COUNT);

        Text("WINDOWING");
        Indent();
        Text("HoveredWindow: '%s'", g.HoveredWindow ? g.HoveredWindow->Name : "NULL");
        Text("HoveredRootWindow: '%s'", g.HoveredRootWindow ? g.HoveredRootWindow->Name : "NULL");
        Text("HoveredWindowUnderMovingWindow: '%s'", g.HoveredWindowUnderMovingWindow ? g.HoveredWindowUnderMovingWindow->Name : "NULL");
        Text("MovingWindow: '%s'", g.MovingWindow ? g.MovingWindow->Name : "NULL");
        Unindent();

        Text("ITEMS");
        Indent();
        Text("ActiveId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d, Source: %s", g.ActiveId, g.ActiveIdPreviousFrame, g.ActiveIdTimer, g.ActiveIdAllowOverlap, input_source_names[g.ActiveIdSource]);
        Text("ActiveIdWindow: '%s'", g.ActiveIdWindow ? g.ActiveIdWindow->Name : "NULL");
        Text("HoveredId: 0x%08X/0x%08X (%.2f sec), AllowOverlap: %d", g.HoveredId, g.HoveredIdPreviousFrame, g.HoveredIdTimer, g.HoveredIdAllowOverlap); // Data is "in-flight" so depending on when the Metrics window is called we may see current frame information or not
        Text("DragDrop: %d, SourceId = 0x%08X, Payload \"%s\" (%d bytes)", g.DragDropActive, g.DragDropPayload.SourceId, g.DragDropPayload.DataType, g.DragDropPayload.DataSize);
        Unindent();

        Text("NAV,FOCUS");
        Indent();
        Text("NavWindow: '%s'", g.NavWindow ? g.NavWindow->Name : "NULL");
        Text("NavId: 0x%08X, NavLayer: %d", g.NavId, g.NavLayer);
        Text("NavInputSource: %s", input_source_names[g.NavInputSource]);
        Text("NavActive: %d, NavVisible: %d", g.IO.NavActive, g.IO.NavVisible);
        Text("NavActivateId: 0x%08X, NavInputId: 0x%08X", g.NavActivateId, g.NavInputId);
        Text("NavDisableHighlight: %d, NavDisableMouseHover: %d", g.NavDisableHighlight, g.NavDisableMouseHover);
        Text("NavFocusScopeId = 0x%08X", g.NavFocusScopeId);
        Text("NavWindowingTarget: '%s'", g.NavWindowingTarget ? g.NavWindowingTarget->Name : "NULL");
        Unindent();

        TreePop();
    }

    // Overlay: Display windows Rectangles and Begin Order
    if (cfg->ShowWindowsRects || cfg->ShowWindowsBeginOrder)
    {
        for (int n = 0; n < g.Windows.Size; n++)
        {
            ImGuiWindow* window = g.Windows[n];
            if (!window->WasActive)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(window);
            if (cfg->ShowWindowsRects)
            {
                ImRect r = Funcs::GetWindowRect(window, cfg->ShowWindowsRectsType);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
            if (cfg->ShowWindowsBeginOrder && !(window->Flags & ImGuiWindowFlags_ChildWindow))
            {
                char buf[32];
                ImFormatString(buf, IM_ARRAYSIZE(buf), "%d", window->BeginOrderWithinContext);
                float font_size = GetFontSize();
                draw_list->AddRectFilled(window->Pos, window->Pos + ImVec2(font_size, font_size), IM_COL32(200, 100, 100, 255));
                draw_list->AddText(window->Pos, IM_COL32(255, 255, 255, 255), buf);
            }
        }
    }

#ifdef IMGUI_HAS_TABLE
    // Overlay: Display Tables Rectangles
    if (cfg->ShowTablesRects)
    {
        for (int table_n = 0; table_n < g.Tables.GetSize(); table_n++)
        {
            ImGuiTable* table = g.Tables.GetByIndex(table_n);
            if (table->LastFrameActive < g.FrameCount - 1)
                continue;
            ImDrawList* draw_list = GetForegroundDrawList(table->OuterWindow);
            if (cfg->ShowTablesRectsType >= TRT_ColumnsRect)
            {
                for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
                {
                    ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, column_n);
                    ImU32 col = (table->HoveredColumnBody == column_n) ? IM_COL32(255, 255, 128, 255) : IM_COL32(255, 0, 128, 255);
                    float thickness = (table->HoveredColumnBody == column_n) ? 3.0f : 1.0f;
                    draw_list->AddRect(r.Min, r.Max, col, 0.0f, ~0, thickness);
                }
            }
            else
            {
                ImRect r = Funcs::GetTableRect(table, cfg->ShowTablesRectsType, -1);
                draw_list->AddRect(r.Min, r.Max, IM_COL32(255, 0, 128, 255));
            }
        }
    }
#endif // #ifdef IMGUI_HAS_TABLE

#ifdef IMGUI_HAS_DOCK
    // Overlay: Display Docking info
    if (show_docking_nodes && g.IO.KeyCtrl)
    {
    }
#endif // #ifdef IMGUI_HAS_DOCK

    End();
}